

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

CappedArray<char,_5UL> __thiscall kj::_::Stringifier::operator*(Stringifier *this,char i)

{
  bool bVar1;
  char *pcVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint8_t *puVar5;
  CappedArray<char,_5UL> CVar6;
  uint8_t reverse [4];
  CappedArray<char,_5UL> result;
  
  result.currentSize = 5;
  if (i == '\0') {
    puVar3 = reverse + 1;
    reverse[0] = '\0';
    pcVar2 = result.content;
  }
  else {
    puVar3 = reverse;
    uVar4 = (uint)(byte)((i ^ i >> 7) - (i >> 7));
    do {
      *puVar3 = (char)uVar4 + (char)(uVar4 / 10) * -10;
      puVar3 = puVar3 + 1;
      bVar1 = 9 < uVar4;
      uVar4 = uVar4 / 10;
    } while (bVar1);
    pcVar2 = result.content;
    if (i < '\0') {
      pcVar2 = result.content + 1;
      result.content[0] = '-';
    }
    if (puVar3 <= reverse) goto LAB_001fbf33;
  }
  puVar5 = (uint8_t *)0x0;
  do {
    *pcVar2 = puVar3[(long)(puVar5 + -1)] + '0';
    pcVar2 = pcVar2 + 1;
    puVar5 = puVar5 + -1;
  } while (reverse + -(long)puVar3 != puVar5);
LAB_001fbf33:
  CVar6.currentSize = (long)pcVar2 - (long)result.content;
  CVar6._8_8_ = CONCAT71(result._9_7_,result.content[0]) & 0xffffffffff;
  return CVar6;
}

Assistant:

CappedArray(): currentSize(fixedSize) {}